

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

void __thiscall
mjs::global_object_impl::define_thrower_accessor
          (global_object_impl *this,object *o,char *property_name)

{
  gc_heap_ptr_untyped local_30;
  gc_heap_ptr_untyped local_20;
  
  (*(this->super_global_object).super_object._vptr_object[0x13])(&local_20,this);
  gc_heap_ptr_untracked<mjs::object,_true>::track
            ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_30,(gc_heap *)&this->thrower_);
  object::define_accessor_property
            (o,(string *)&local_20,(object_ptr *)&local_30,dont_delete|dont_enum);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  return;
}

Assistant:

void define_thrower_accessor(object& o, const char* property_name) override {
        o.define_accessor_property(common_string(property_name), thrower_.track(heap()), property_attribute::dont_enum|property_attribute::dont_delete);
    }